

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HModel.cpp
# Opt level: O1

void __thiscall HModel::computeDualInfeasInDual(HModel *this,int *dualInfeasCount)

{
  double dVar1;
  double dVar2;
  pointer pdVar3;
  pointer pdVar4;
  long lVar5;
  int iVar6;
  
  if ((long)this->numTot < 1) {
    iVar6 = 0;
  }
  else {
    pdVar3 = (this->workUpper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar4 = (this->workDual).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar5 = 0;
    iVar6 = 0;
    do {
      if ((this->nonbasicFlag).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start[lVar5] != 0) {
        dVar1 = (this->workLower).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[lVar5];
        if ((((dVar1 == -1e+200) && (!NAN(dVar1))) && (dVar2 = pdVar3[lVar5], dVar2 == 1e+200)) &&
           (!NAN(dVar2))) {
          iVar6 = (iVar6 + 1) - (uint)(ABS(pdVar4[lVar5]) < this->dblOption[2]);
        }
        if (((dVar1 == -1e+200) && (!NAN(dVar1))) ||
           ((dVar1 = pdVar3[lVar5], dVar1 == 1e+200 && (!NAN(dVar1))))) {
          iVar6 = (iVar6 + 1) -
                  (uint)(-this->dblOption[2] <
                        (double)(this->nonbasicMove).super__Vector_base<int,_std::allocator<int>_>.
                                _M_impl.super__Vector_impl_data._M_start[lVar5] * pdVar4[lVar5]);
        }
      }
      lVar5 = lVar5 + 1;
    } while (this->numTot != lVar5);
  }
  *dualInfeasCount = iVar6;
  return;
}

Assistant:

void HModel::computeDualInfeasInDual(int *dualInfeasCount) {
    int workCount = 0;
    const double inf = HSOL_CONST_INF;
    const double tau_d = dblOption[DBLOPT_DUAL_TOL];
    for (int i = 0; i < numTot; i++) {
        // Only for non basic variables
        if (!nonbasicFlag[i])
            continue;
        // Free
        if (workLower[i] == -inf && workUpper[i] == inf)
            workCount += (fabs(workDual[i]) >= tau_d);
        // In dual, assuming that boxed variables will be flipped
        if (workLower[i] == -inf || workUpper[i] == inf)
            workCount += (nonbasicMove[i] * workDual[i] <= -tau_d);
    }
    *dualInfeasCount = workCount;
}